

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_sort.cpp
# Opt level: O0

void Omega_h::parallel_sort<int,Omega_h::CompareKeySets<long,1>>
               (int *b,int *e,CompareKeySets<long,_1> c)

{
  int *e_local;
  int *b_local;
  CompareKeySets<long,_1> c_local;
  
  begin_code("parallel_sort",(char *)0x0);
  std::stable_sort<int*,Omega_h::CompareKeySets<long,1>>(b,e,c);
  end_code();
  return;
}

Assistant:

static void parallel_sort(T* b, T* e, Comp c) {
  begin_code("parallel_sort");
#if defined(OMEGA_H_USE_CUDA)
  auto bptr = thrust::device_ptr<T>(b);
  auto eptr = thrust::device_ptr<T>(e);
  thrust::stable_sort(bptr, eptr, c);
#elif defined(OMEGA_H_USE_OPENMP)
  pss::parallel_stable_sort(b, e, c);
#else
  std::stable_sort(b, e, c);
#endif
  end_code();
}